

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  undefined2 *puVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  ulong uVar10;
  undefined2 *puVar11;
  
  puVar4 = (undefined2 *)decode->unpacked_buffer;
  peVar3 = decode->channels;
  uVar1 = peVar3->width;
  lVar5 = (long)(int)uVar1;
  iVar6 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  puVar8 = peVar3[2].field_12.decode_to_ptr;
  iVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar9 != iVar6; iVar9 = iVar9 + 1) {
    puVar11 = puVar4;
    for (lVar7 = 0; uVar10 * 3 != lVar7; lVar7 = lVar7 + 3) {
      *(undefined2 *)(puVar8 + lVar7 * 2) = puVar11[lVar5 * 2];
      *(undefined2 *)(puVar8 + lVar7 * 2 + 2) = puVar11[lVar5];
      *(undefined2 *)(puVar8 + lVar7 * 2 + 4) = *puVar11;
      puVar11 = puVar11 + 1;
    }
    puVar4 = puVar4 + lVar5 * 3;
    puVar8 = puVar8 + iVar2;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer; // B
        in1 = in0 + w;                     // G
        in2 = in1 + w;                     // R

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in2[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in0[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}